

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_test.cc
# Opt level: O2

void __thiscall
bssl::anon_unknown_0::SSLTest_ECHThreads_Test::TestBody(SSLTest_ECHThreads_Test *this)

{
  allocator_type *paVar1;
  pointer ptVar2;
  pointer ptVar3;
  bool bVar4;
  int iVar5;
  EVP_HPKE_KEM *pEVar6;
  SSL_METHOD *method;
  SSL_METHOD *meth;
  size_type sVar7;
  pointer ptVar8;
  thread *ptVar9;
  allocator_type *__a;
  anon_class_16_2_60d54371_for__M_head_impl *__args;
  anon_class_16_2_80de2b63_for__M_head_impl *__args_00;
  anon_class_16_2_80de2b63_for__M_head_impl *__args_01;
  thread *thread;
  UniquePtr<uint8_t> *this_00;
  char *in_R9;
  char *pcVar10;
  UniquePtr<SSL_CTX> server_ctx;
  UniquePtr<SSL_CTX> client_ctx;
  AssertionResult gtest_ar__2;
  vector<std::thread,_std::allocator<std::thread>_> threads;
  UniquePtr<SSL> client;
  UniquePtr<SSL_ECH_KEYS> keys12;
  UniquePtr<SSL_ECH_KEYS> keys1;
  AssertHelper local_158;
  __uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_150;
  uint8_t *ech_config1;
  UniquePtr<SSL> server;
  UniquePtr<uint8_t> free_ech_config2;
  uint8_t *ech_config2;
  UniquePtr<uint8_t> free_ech_config1;
  size_t ech_config2_len;
  size_t ech_config1_len;
  ScopedEVP_HPKE_KEY key2;
  ScopedEVP_HPKE_KEY key1;
  
  EVP_HPKE_KEY_zero(&key1.ctx_);
  pEVar6 = EVP_hpke_x25519_hkdf_sha256();
  iVar5 = EVP_HPKE_KEY_generate(&key1.ctx_,pEVar6);
  threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)CONCAT71(threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>.
                         _M_impl.super__Vector_impl_data._M_start._1_7_,iVar5 != 0);
  if (iVar5 == 0) {
    testing::Message::Message((Message *)&gtest_ar__2);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&key2,(internal *)&threads,
               (AssertionResult *)"EVP_HPKE_KEY_generate(key1.get(), EVP_hpke_x25519_hkdf_sha256())"
               ,"false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&ech_config1,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
               ,0x9a5,(char *)key2.ctx_.kem);
    testing::internal::AssertHelper::operator=((AssertHelper *)&ech_config1,(Message *)&gtest_ar__2)
    ;
    this_00 = (UniquePtr<uint8_t> *)&ech_config1;
  }
  else {
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
                      super__Vector_impl_data._M_finish);
    pcVar10 = (char *)0x10;
    iVar5 = SSL_marshal_ech_config
                      (&ech_config1,&ech_config1_len,'\x01',&key1.ctx_,"public.example",0x10);
    threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
    super__Vector_impl_data._M_start =
         (pointer)CONCAT71(threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>.
                           _M_impl.super__Vector_impl_data._M_start._1_7_,iVar5 != 0);
    if (iVar5 != 0) {
      std::
      unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>.
                        _M_impl.super__Vector_impl_data._M_finish);
      free_ech_config1._M_t.super___uniq_ptr_impl<unsigned_char,_bssl::internal::Deleter>._M_t.
      super__Tuple_impl<0UL,_unsigned_char_*,_bssl::internal::Deleter>.
      super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl =
           (__uniq_ptr_data<unsigned_char,_bssl::internal::Deleter,_true,_true>)
           (__uniq_ptr_data<unsigned_char,_bssl::internal::Deleter,_true,_true>)ech_config1;
      EVP_HPKE_KEY_zero(&key2.ctx_);
      pEVar6 = EVP_hpke_x25519_hkdf_sha256();
      iVar5 = EVP_HPKE_KEY_generate(&key2.ctx_,pEVar6);
      gtest_ar__2.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl =
           (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
            )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )0x0;
      gtest_ar__2.success_ = iVar5 != 0;
      if (iVar5 == 0) {
        testing::Message::Message((Message *)&ech_config2);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)&threads,(internal *)&gtest_ar__2,
                   (AssertionResult *)
                   "EVP_HPKE_KEY_generate(key2.get(), EVP_hpke_x25519_hkdf_sha256())","false","true"
                   ,pcVar10);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&ech_config2_len,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                   ,0x9ad,(char *)threads.
                                  super__Vector_base<std::thread,_std::allocator<std::thread>_>.
                                  _M_impl.super__Vector_impl_data._M_start);
        testing::internal::AssertHelper::operator=
                  ((AssertHelper *)&ech_config2_len,(Message *)&ech_config2);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&ech_config2_len);
        std::__cxx11::string::~string((string *)&threads);
LAB_00161fb0:
        if ((tuple<unsigned_char_*,_bssl::internal::Deleter>)ech_config2 !=
            (_Head_base<0UL,_unsigned_char_*,_false>)0x0) {
          (**(code **)(*(long *)ech_config2 + 8))();
        }
        std::
        unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~unique_ptr(&gtest_ar__2.message_);
      }
      else {
        std::
        unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~unique_ptr(&gtest_ar__2.message_);
        pcVar10 = (char *)0x10;
        iVar5 = SSL_marshal_ech_config
                          (&ech_config2,&ech_config2_len,'\x02',&key2.ctx_,"public.example",0x10);
        gtest_ar__2.message_._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl =
             (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
              )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )0x0;
        gtest_ar__2.success_ = iVar5 != 0;
        if (iVar5 == 0) {
          testing::Message::Message((Message *)&free_ech_config2);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    ((string *)&threads,(internal *)&gtest_ar__2,
                     (AssertionResult *)
                     "SSL_marshal_ech_config(&ech_config2, &ech_config2_len, 2, key2.get(), \"public.example\", 16)"
                     ,"false","true",pcVar10);
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&keys1,kFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                     ,0x9b2,(char *)threads.
                                    super__Vector_base<std::thread,_std::allocator<std::thread>_>.
                                    _M_impl.super__Vector_impl_data._M_start);
          testing::internal::AssertHelper::operator=
                    ((AssertHelper *)&keys1,(Message *)&free_ech_config2);
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&keys1);
          std::__cxx11::string::~string((string *)&threads);
          ech_config2 = (uint8_t *)free_ech_config2;
          goto LAB_00161fb0;
        }
        std::
        unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~unique_ptr(&gtest_ar__2.message_);
        free_ech_config2._M_t.super___uniq_ptr_impl<unsigned_char,_bssl::internal::Deleter>._M_t.
        super__Tuple_impl<0UL,_unsigned_char_*,_bssl::internal::Deleter>.
        super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl =
             (__uniq_ptr_data<unsigned_char,_bssl::internal::Deleter,_true,_true>)
             (__uniq_ptr_data<unsigned_char,_bssl::internal::Deleter,_true,_true>)ech_config2;
        keys1._M_t.super___uniq_ptr_impl<ssl_ech_keys_st,_bssl::internal::Deleter>._M_t.
        super__Tuple_impl<0UL,_ssl_ech_keys_st_*,_bssl::internal::Deleter>.
        super__Head_base<0UL,_ssl_ech_keys_st_*,_false>._M_head_impl =
             (__uniq_ptr_data<ssl_ech_keys_st,_bssl::internal::Deleter,_true,_true>)
             SSL_ECH_KEYS_new();
        gtest_ar__2.message_._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl =
             (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
              )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )0x0;
        gtest_ar__2.success_ =
             (tuple<ssl_ech_keys_st_*,_bssl::internal::Deleter>)
             keys1._M_t.super___uniq_ptr_impl<ssl_ech_keys_st,_bssl::internal::Deleter>._M_t.
             super__Tuple_impl<0UL,_ssl_ech_keys_st_*,_bssl::internal::Deleter>.
             super__Head_base<0UL,_ssl_ech_keys_st_*,_false>._M_head_impl !=
             (_Head_base<0UL,_ssl_ech_keys_st_*,_false>)0x0;
        if ((tuple<ssl_ech_keys_st_*,_bssl::internal::Deleter>)
            keys1._M_t.super___uniq_ptr_impl<ssl_ech_keys_st,_bssl::internal::Deleter>._M_t.
            super__Tuple_impl<0UL,_ssl_ech_keys_st_*,_bssl::internal::Deleter>.
            super__Head_base<0UL,_ssl_ech_keys_st_*,_false>._M_head_impl ==
            (_Head_base<0UL,_ssl_ech_keys_st_*,_false>)0x0) {
          testing::Message::Message((Message *)&keys12);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    ((string *)&threads,(internal *)&gtest_ar__2,(AssertionResult *)"keys1","false",
                     "true",pcVar10);
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&server_ctx,kFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                     ,0x9b7,(char *)threads.
                                    super__Vector_base<std::thread,_std::allocator<std::thread>_>.
                                    _M_impl.super__Vector_impl_data._M_start);
          testing::internal::AssertHelper::operator=((AssertHelper *)&server_ctx,(Message *)&keys12)
          ;
LAB_00162078:
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&server_ctx);
          std::__cxx11::string::~string((string *)&threads);
          if ((__uniq_ptr_impl<ssl_ech_keys_st,_bssl::internal::Deleter>)
              keys12._M_t.super___uniq_ptr_impl<ssl_ech_keys_st,_bssl::internal::Deleter>._M_t.
              super__Tuple_impl<0UL,_ssl_ech_keys_st_*,_bssl::internal::Deleter>.
              super__Head_base<0UL,_ssl_ech_keys_st_*,_false>._M_head_impl !=
              (__uniq_ptr_impl<ssl_ech_keys_st,_bssl::internal::Deleter>)0x0) {
            (**(code **)(*(long *)keys12._M_t.
                                  super___uniq_ptr_impl<ssl_ech_keys_st,_bssl::internal::Deleter>.
                                  _M_t.
                                  super__Tuple_impl<0UL,_ssl_ech_keys_st_*,_bssl::internal::Deleter>
                                  .super__Head_base<0UL,_ssl_ech_keys_st_*,_false>._M_head_impl + 8)
            )();
          }
          std::
          unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~unique_ptr(&gtest_ar__2.message_);
        }
        else {
          std::
          unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~unique_ptr(&gtest_ar__2.message_);
          iVar5 = SSL_ECH_KEYS_add((SSL_ECH_KEYS *)
                                   keys1._M_t.
                                   super___uniq_ptr_impl<ssl_ech_keys_st,_bssl::internal::Deleter>.
                                   _M_t.
                                   super__Tuple_impl<0UL,_ssl_ech_keys_st_*,_bssl::internal::Deleter>
                                   .super__Head_base<0UL,_ssl_ech_keys_st_*,_false>._M_head_impl,1,
                                   ech_config1,ech_config1_len,&key1.ctx_);
          gtest_ar__2.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl =
               (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  )0x0;
          gtest_ar__2.success_ = iVar5 != 0;
          if (iVar5 == 0) {
            testing::Message::Message((Message *)&keys12);
            testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                      ((string *)&threads,(internal *)&gtest_ar__2,
                       (AssertionResult *)
                       "SSL_ECH_KEYS_add(keys1.get(), 1, ech_config1, ech_config1_len, key1.get())",
                       "false","true",pcVar10);
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)&server_ctx,kFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                       ,0x9b9,(char *)threads.
                                      super__Vector_base<std::thread,_std::allocator<std::thread>_>.
                                      _M_impl.super__Vector_impl_data._M_start);
            testing::internal::AssertHelper::operator=
                      ((AssertHelper *)&server_ctx,(Message *)&keys12);
            goto LAB_00162078;
          }
          std::
          unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~unique_ptr(&gtest_ar__2.message_);
          keys12._M_t.super___uniq_ptr_impl<ssl_ech_keys_st,_bssl::internal::Deleter>._M_t.
          super__Tuple_impl<0UL,_ssl_ech_keys_st_*,_bssl::internal::Deleter>.
          super__Head_base<0UL,_ssl_ech_keys_st_*,_false>._M_head_impl =
               (__uniq_ptr_data<ssl_ech_keys_st,_bssl::internal::Deleter,_true,_true>)
               SSL_ECH_KEYS_new();
          gtest_ar__2.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl =
               (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  )0x0;
          gtest_ar__2.success_ =
               (tuple<ssl_ech_keys_st_*,_bssl::internal::Deleter>)
               keys12._M_t.super___uniq_ptr_impl<ssl_ech_keys_st,_bssl::internal::Deleter>._M_t.
               super__Tuple_impl<0UL,_ssl_ech_keys_st_*,_bssl::internal::Deleter>.
               super__Head_base<0UL,_ssl_ech_keys_st_*,_false>._M_head_impl !=
               (_Head_base<0UL,_ssl_ech_keys_st_*,_false>)0x0;
          if ((tuple<ssl_ech_keys_st_*,_bssl::internal::Deleter>)
              keys12._M_t.super___uniq_ptr_impl<ssl_ech_keys_st,_bssl::internal::Deleter>._M_t.
              super__Tuple_impl<0UL,_ssl_ech_keys_st_*,_bssl::internal::Deleter>.
              super__Head_base<0UL,_ssl_ech_keys_st_*,_false>._M_head_impl ==
              (_Head_base<0UL,_ssl_ech_keys_st_*,_false>)0x0) {
            testing::Message::Message((Message *)&server_ctx);
            testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                      ((string *)&threads,(internal *)&gtest_ar__2,(AssertionResult *)"keys12",
                       "false","true",pcVar10);
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)&client_ctx,kFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                       ,0x9bb,(char *)threads.
                                      super__Vector_base<std::thread,_std::allocator<std::thread>_>.
                                      _M_impl.super__Vector_impl_data._M_start);
            testing::internal::AssertHelper::operator=
                      ((AssertHelper *)&client_ctx,(Message *)&server_ctx);
LAB_001621b3:
            testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&client_ctx);
            std::__cxx11::string::~string((string *)&threads);
            if ((__uniq_ptr_impl<ssl_ctx_st,_bssl::internal::Deleter>)
                server_ctx._M_t.super___uniq_ptr_impl<ssl_ctx_st,_bssl::internal::Deleter>._M_t.
                super__Tuple_impl<0UL,_ssl_ctx_st_*,_bssl::internal::Deleter>.
                super__Head_base<0UL,_ssl_ctx_st_*,_false>._M_head_impl !=
                (__uniq_ptr_impl<ssl_ctx_st,_bssl::internal::Deleter>)0x0) {
              (**(code **)(*(long *)server_ctx._M_t.
                                    super___uniq_ptr_impl<ssl_ctx_st,_bssl::internal::Deleter>._M_t.
                                    super__Tuple_impl<0UL,_ssl_ctx_st_*,_bssl::internal::Deleter>.
                                    super__Head_base<0UL,_ssl_ctx_st_*,_false>._M_head_impl + 8))();
            }
            std::
            unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~unique_ptr(&gtest_ar__2.message_);
          }
          else {
            std::
            unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~unique_ptr(&gtest_ar__2.message_);
            iVar5 = SSL_ECH_KEYS_add((SSL_ECH_KEYS *)
                                     keys12._M_t.
                                     super___uniq_ptr_impl<ssl_ech_keys_st,_bssl::internal::Deleter>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_ssl_ech_keys_st_*,_bssl::internal::Deleter>
                                     .super__Head_base<0UL,_ssl_ech_keys_st_*,_false>._M_head_impl,1
                                     ,ech_config2,ech_config2_len,&key2.ctx_);
            gtest_ar__2.message_._M_t.
            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
            ._M_head_impl =
                 (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                  )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )0x0;
            gtest_ar__2.success_ = iVar5 != 0;
            if (iVar5 == 0) {
              testing::Message::Message((Message *)&server_ctx);
              testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                        ((string *)&threads,(internal *)&gtest_ar__2,
                         (AssertionResult *)
                         "SSL_ECH_KEYS_add(keys12.get(), 1, ech_config2, ech_config2_len, key2.get())"
                         ,"false","true",pcVar10);
              testing::internal::AssertHelper::AssertHelper
                        ((AssertHelper *)&client_ctx,kFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                         ,0x9bd,(char *)threads.
                                        super__Vector_base<std::thread,_std::allocator<std::thread>_>
                                        ._M_impl.super__Vector_impl_data._M_start);
              testing::internal::AssertHelper::operator=
                        ((AssertHelper *)&client_ctx,(Message *)&server_ctx);
              goto LAB_001621b3;
            }
            std::
            unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~unique_ptr(&gtest_ar__2.message_);
            iVar5 = SSL_ECH_KEYS_add((SSL_ECH_KEYS *)
                                     keys12._M_t.
                                     super___uniq_ptr_impl<ssl_ech_keys_st,_bssl::internal::Deleter>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_ssl_ech_keys_st_*,_bssl::internal::Deleter>
                                     .super__Head_base<0UL,_ssl_ech_keys_st_*,_false>._M_head_impl,0
                                     ,ech_config1,ech_config1_len,&key1.ctx_);
            gtest_ar__2.message_._M_t.
            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
            ._M_head_impl =
                 (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                  )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )0x0;
            gtest_ar__2.success_ = iVar5 != 0;
            if (iVar5 == 0) {
              testing::Message::Message((Message *)&server_ctx);
              testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                        ((string *)&threads,(internal *)&gtest_ar__2,
                         (AssertionResult *)
                         "SSL_ECH_KEYS_add(keys12.get(), 0, ech_config1, ech_config1_len, key1.get())"
                         ,"false","true",pcVar10);
              testing::internal::AssertHelper::AssertHelper
                        ((AssertHelper *)&client_ctx,kFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                         ,0x9bf,(char *)threads.
                                        super__Vector_base<std::thread,_std::allocator<std::thread>_>
                                        ._M_impl.super__Vector_impl_data._M_start);
              testing::internal::AssertHelper::operator=
                        ((AssertHelper *)&client_ctx,(Message *)&server_ctx);
              goto LAB_001621b3;
            }
            std::
            unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~unique_ptr(&gtest_ar__2.message_);
            method = TLS_method();
            CreateContextWithTestCertificate((anon_unknown_0 *)&server_ctx,method);
            gtest_ar__2.message_._M_t.
            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
            ._M_head_impl =
                 (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                  )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )0x0;
            gtest_ar__2.success_ =
                 (__uniq_ptr_impl<ssl_ctx_st,_bssl::internal::Deleter>)
                 server_ctx._M_t.super___uniq_ptr_impl<ssl_ctx_st,_bssl::internal::Deleter>._M_t.
                 super__Tuple_impl<0UL,_ssl_ctx_st_*,_bssl::internal::Deleter>.
                 super__Head_base<0UL,_ssl_ctx_st_*,_false>._M_head_impl !=
                 (__uniq_ptr_impl<ssl_ctx_st,_bssl::internal::Deleter>)0x0;
            if ((__uniq_ptr_impl<ssl_ctx_st,_bssl::internal::Deleter>)
                server_ctx._M_t.super___uniq_ptr_impl<ssl_ctx_st,_bssl::internal::Deleter>._M_t.
                super__Tuple_impl<0UL,_ssl_ctx_st_*,_bssl::internal::Deleter>.
                super__Head_base<0UL,_ssl_ctx_st_*,_false>._M_head_impl ==
                (__uniq_ptr_impl<ssl_ctx_st,_bssl::internal::Deleter>)0x0) {
              testing::Message::Message((Message *)&client_ctx);
              testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                        ((string *)&threads,(internal *)&gtest_ar__2,(AssertionResult *)"server_ctx"
                         ,"false","true",pcVar10);
              testing::internal::AssertHelper::AssertHelper
                        ((AssertHelper *)&client,kFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                         ,0x9c3,(char *)threads.
                                        super__Vector_base<std::thread,_std::allocator<std::thread>_>
                                        ._M_impl.super__Vector_impl_data._M_start);
              testing::internal::AssertHelper::operator=
                        ((AssertHelper *)&client,(Message *)&client_ctx);
LAB_0016229b:
              testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&client);
              std::__cxx11::string::~string((string *)&threads);
              if ((__uniq_ptr_impl<ssl_ctx_st,_bssl::internal::Deleter>)
                  client_ctx._M_t.super___uniq_ptr_impl<ssl_ctx_st,_bssl::internal::Deleter>._M_t.
                  super__Tuple_impl<0UL,_ssl_ctx_st_*,_bssl::internal::Deleter>.
                  super__Head_base<0UL,_ssl_ctx_st_*,_false>._M_head_impl !=
                  (__uniq_ptr_impl<ssl_ctx_st,_bssl::internal::Deleter>)0x0) {
                (**(code **)(*(long *)client_ctx._M_t.
                                      super___uniq_ptr_impl<ssl_ctx_st,_bssl::internal::Deleter>.
                                      _M_t.
                                      super__Tuple_impl<0UL,_ssl_ctx_st_*,_bssl::internal::Deleter>.
                                      super__Head_base<0UL,_ssl_ctx_st_*,_false>._M_head_impl + 8))
                          ();
              }
              std::
              unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::~unique_ptr(&gtest_ar__2.message_);
            }
            else {
              std::
              unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::~unique_ptr(&gtest_ar__2.message_);
              iVar5 = SSL_CTX_set1_ech_keys
                                ((SSL_CTX *)
                                 server_ctx._M_t.
                                 super___uniq_ptr_impl<ssl_ctx_st,_bssl::internal::Deleter>._M_t.
                                 super__Tuple_impl<0UL,_ssl_ctx_st_*,_bssl::internal::Deleter>.
                                 super__Head_base<0UL,_ssl_ctx_st_*,_false>._M_head_impl,
                                 (SSL_ECH_KEYS *)
                                 keys1._M_t.
                                 super___uniq_ptr_impl<ssl_ech_keys_st,_bssl::internal::Deleter>.
                                 _M_t.
                                 super__Tuple_impl<0UL,_ssl_ech_keys_st_*,_bssl::internal::Deleter>.
                                 super__Head_base<0UL,_ssl_ech_keys_st_*,_false>._M_head_impl);
              gtest_ar__2.message_._M_t.
              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_t.
              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              .
              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
              ._M_head_impl =
                   (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                    )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      )0x0;
              gtest_ar__2.success_ = iVar5 != 0;
              if (iVar5 == 0) {
                testing::Message::Message((Message *)&client_ctx);
                testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                          ((string *)&threads,(internal *)&gtest_ar__2,
                           (AssertionResult *)"SSL_CTX_set1_ech_keys(server_ctx.get(), keys1.get())"
                           ,"false","true",pcVar10);
                testing::internal::AssertHelper::AssertHelper
                          ((AssertHelper *)&client,kFatalFailure,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                           ,0x9c4,(char *)threads.
                                          super__Vector_base<std::thread,_std::allocator<std::thread>_>
                                          ._M_impl.super__Vector_impl_data._M_start);
                testing::internal::AssertHelper::operator=
                          ((AssertHelper *)&client,(Message *)&client_ctx);
                goto LAB_0016229b;
              }
              std::
              unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::~unique_ptr(&gtest_ar__2.message_);
              meth = (SSL_METHOD *)TLS_method();
              client_ctx._M_t.super___uniq_ptr_impl<ssl_ctx_st,_bssl::internal::Deleter>._M_t.
              super__Tuple_impl<0UL,_ssl_ctx_st_*,_bssl::internal::Deleter>.
              super__Head_base<0UL,_ssl_ctx_st_*,_false>._M_head_impl =
                   (__uniq_ptr_data<ssl_ctx_st,_bssl::internal::Deleter,_true,_true>)
                   SSL_CTX_new(meth);
              gtest_ar__2.message_._M_t.
              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_t.
              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              .
              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
              ._M_head_impl =
                   (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                    )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      )0x0;
              gtest_ar__2.success_ =
                   (tuple<ssl_ctx_st_*,_bssl::internal::Deleter>)
                   client_ctx._M_t.super___uniq_ptr_impl<ssl_ctx_st,_bssl::internal::Deleter>._M_t.
                   super__Tuple_impl<0UL,_ssl_ctx_st_*,_bssl::internal::Deleter>.
                   super__Head_base<0UL,_ssl_ctx_st_*,_false>._M_head_impl !=
                   (_Head_base<0UL,_ssl_ctx_st_*,_false>)0x0;
              if ((tuple<ssl_ctx_st_*,_bssl::internal::Deleter>)
                  client_ctx._M_t.super___uniq_ptr_impl<ssl_ctx_st,_bssl::internal::Deleter>._M_t.
                  super__Tuple_impl<0UL,_ssl_ctx_st_*,_bssl::internal::Deleter>.
                  super__Head_base<0UL,_ssl_ctx_st_*,_false>._M_head_impl ==
                  (_Head_base<0UL,_ssl_ctx_st_*,_false>)0x0) {
                testing::Message::Message((Message *)&client);
                testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                          ((string *)&threads,(internal *)&gtest_ar__2,
                           (AssertionResult *)"client_ctx","false","true",pcVar10);
                testing::internal::AssertHelper::AssertHelper
                          ((AssertHelper *)&server,kFatalFailure,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                           ,0x9c7,(char *)threads.
                                          super__Vector_base<std::thread,_std::allocator<std::thread>_>
                                          ._M_impl.super__Vector_impl_data._M_start);
                testing::internal::AssertHelper::operator=
                          ((AssertHelper *)&server,(Message *)&client);
                testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&server);
                std::__cxx11::string::~string((string *)&threads);
                if ((__uniq_ptr_impl<ssl_st,_bssl::internal::Deleter>)
                    client._M_t.super___uniq_ptr_impl<ssl_st,_bssl::internal::Deleter>._M_t.
                    super__Tuple_impl<0UL,_ssl_st_*,_bssl::internal::Deleter>.
                    super__Head_base<0UL,_ssl_st_*,_false>._M_head_impl !=
                    (__uniq_ptr_impl<ssl_st,_bssl::internal::Deleter>)0x0) {
                  (**(code **)(*(long *)client._M_t.
                                        super___uniq_ptr_impl<ssl_st,_bssl::internal::Deleter>._M_t.
                                        super__Tuple_impl<0UL,_ssl_st_*,_bssl::internal::Deleter>.
                                        super__Head_base<0UL,_ssl_st_*,_false>._M_head_impl + 8))();
                }
                std::
                unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::~unique_ptr(&gtest_ar__2.message_);
              }
              else {
                std::
                unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::~unique_ptr(&gtest_ar__2.message_);
                client._M_t.super___uniq_ptr_impl<ssl_st,_bssl::internal::Deleter>._M_t.
                super__Tuple_impl<0UL,_ssl_st_*,_bssl::internal::Deleter>.
                super__Head_base<0UL,_ssl_st_*,_false>._M_head_impl =
                     (__uniq_ptr_data<ssl_st,_bssl::internal::Deleter,_true,_true>)
                     (__uniq_ptr_impl<ssl_st,_bssl::internal::Deleter>)0x0;
                server._M_t.super___uniq_ptr_impl<ssl_st,_bssl::internal::Deleter>._M_t.
                super__Tuple_impl<0UL,_ssl_st_*,_bssl::internal::Deleter>.
                super__Head_base<0UL,_ssl_st_*,_false>._M_head_impl =
                     (__uniq_ptr_data<ssl_st,_bssl::internal::Deleter,_true,_true>)
                     (__uniq_ptr_impl<ssl_st,_bssl::internal::Deleter>)0x0;
                bVar4 = CreateClientAndServer
                                  (&client,&server,
                                   (SSL_CTX *)
                                   client_ctx._M_t.
                                   super___uniq_ptr_impl<ssl_ctx_st,_bssl::internal::Deleter>._M_t.
                                   super__Tuple_impl<0UL,_ssl_ctx_st_*,_bssl::internal::Deleter>.
                                   super__Head_base<0UL,_ssl_ctx_st_*,_false>._M_head_impl,
                                   (SSL_CTX *)
                                   server_ctx._M_t.
                                   super___uniq_ptr_impl<ssl_ctx_st,_bssl::internal::Deleter>._M_t.
                                   super__Tuple_impl<0UL,_ssl_ctx_st_*,_bssl::internal::Deleter>.
                                   super__Head_base<0UL,_ssl_ctx_st_*,_false>._M_head_impl);
                gtest_ar__2.success_ = bVar4;
                gtest_ar__2.message_._M_t.
                super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_t.
                super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                .
                super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                ._M_head_impl =
                     (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                      )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        )0x0;
                if (bVar4) {
                  std::
                  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::~unique_ptr(&gtest_ar__2.message_);
                  bVar4 = InstallECHConfigList
                                    ((SSL *)client._M_t.
                                            super___uniq_ptr_impl<ssl_st,_bssl::internal::Deleter>.
                                            _M_t.
                                            super__Tuple_impl<0UL,_ssl_st_*,_bssl::internal::Deleter>
                                            .super__Head_base<0UL,_ssl_st_*,_false>._M_head_impl,
                                     (SSL_ECH_KEYS *)
                                     keys1._M_t.
                                     super___uniq_ptr_impl<ssl_ech_keys_st,_bssl::internal::Deleter>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_ssl_ech_keys_st_*,_bssl::internal::Deleter>
                                     .super__Head_base<0UL,_ssl_ech_keys_st_*,_false>._M_head_impl);
                  gtest_ar__2.success_ = bVar4;
                  gtest_ar__2.message_._M_t.
                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  .
                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                  ._M_head_impl =
                       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          )0x0;
                  if (!bVar4) {
                    testing::Message::Message((Message *)&local_150);
                    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                              ((string *)&threads,(internal *)&gtest_ar__2,
                               (AssertionResult *)"InstallECHConfigList(client.get(), keys1.get())",
                               "false","true",pcVar10);
                    testing::internal::AssertHelper::AssertHelper
                              (&local_158,kFatalFailure,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                               ,0x9cb,(char *)threads.
                                              super__Vector_base<std::thread,_std::allocator<std::thread>_>
                                              ._M_impl.super__Vector_impl_data._M_start);
                    testing::internal::AssertHelper::operator=(&local_158,(Message *)&local_150);
                    goto LAB_00162410;
                  }
                  std::
                  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::~unique_ptr(&gtest_ar__2.message_);
                  threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
                  threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
                  super__Vector_impl_data._M_start = (pointer)0x0;
                  threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
                  super__Vector_impl_data._M_finish = (pointer)0x0;
                  gtest_ar__2._0_8_ = &client;
                  gtest_ar__2.message_._M_t.
                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  .
                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                  ._M_head_impl =
                       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                        )(__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                          )&server;
                  sVar7 = std::vector<std::thread,_std::allocator<std::thread>_>::_M_check_len
                                    (&threads,1,"vector::_M_realloc_insert");
                  ptVar3 = threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>.
                           _M_impl.super__Vector_impl_data._M_finish;
                  ptVar2 = threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>.
                           _M_impl.super__Vector_impl_data._M_start;
                  ptVar8 = std::_Vector_base<std::thread,_std::allocator<std::thread>_>::_M_allocate
                                     (&threads.
                                       super__Vector_base<std::thread,_std::allocator<std::thread>_>
                                      ,sVar7);
                  std::allocator_traits<std::allocator<std::thread>>::
                  construct<std::thread,bssl::(anonymous_namespace)::SSLTest_ECHThreads_Test::TestBody()::__0>
                            ((allocator_type *)((long)ptVar8 - (long)ptVar2),(thread *)&gtest_ar__2,
                             __args);
                  ptVar9 = std::
                           __relocate_a_1<std::thread*,std::thread*,std::allocator<std::thread>>
                                     (ptVar2,(thread *)0x0,ptVar8,(allocator<std::thread> *)&threads
                                     );
                  __a = (allocator_type *)
                        std::__relocate_a_1<std::thread*,std::thread*,std::allocator<std::thread>>
                                  ((thread *)0x0,ptVar3,ptVar9 + 1,
                                   (allocator<std::thread> *)&threads);
                  std::_Vector_base<std::thread,_std::allocator<std::thread>_>::_M_deallocate
                            ((_Vector_base<std::thread,_std::allocator<std::thread>_> *)&threads,
                             ptVar2,(long)threads.
                                          super__Vector_base<std::thread,_std::allocator<std::thread>_>
                                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                    (long)ptVar2 >> 3);
                  paVar1 = (allocator_type *)(ptVar8 + sVar7);
                  gtest_ar__2.message_._M_t.
                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  .
                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                  ._M_head_impl =
                       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                        )&keys12;
                  threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
                  super__Vector_impl_data._M_start = ptVar8;
                  threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
                  super__Vector_impl_data._M_finish = (pointer)__a;
                  threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage = (pointer)paVar1;
                  if (__a == paVar1) {
                    gtest_ar__2._0_8_ = &server_ctx;
                    sVar7 = std::vector<std::thread,_std::allocator<std::thread>_>::_M_check_len
                                      (&threads,1,"vector::_M_realloc_insert");
                    ptVar3 = threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>.
                             _M_impl.super__Vector_impl_data._M_finish;
                    ptVar2 = threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>.
                             _M_impl.super__Vector_impl_data._M_start;
                    ptVar8 = std::_Vector_base<std::thread,_std::allocator<std::thread>_>::
                             _M_allocate(&threads.
                                          super__Vector_base<std::thread,_std::allocator<std::thread>_>
                                         ,sVar7);
                    std::allocator_traits<std::allocator<std::thread>>::
                    construct<std::thread,bssl::(anonymous_namespace)::SSLTest_ECHThreads_Test::TestBody()::__1>
                              ((allocator_type *)(((long)paVar1 - (long)ptVar2) + (long)ptVar8),
                               (thread *)&gtest_ar__2,__args_01);
                    ptVar9 = std::
                             __relocate_a_1<std::thread*,std::thread*,std::allocator<std::thread>>
                                       (ptVar2,(thread *)__a,ptVar8,
                                        (allocator<std::thread> *)&threads);
                    ptVar9 = std::
                             __relocate_a_1<std::thread*,std::thread*,std::allocator<std::thread>>
                                       ((thread *)__a,ptVar3,ptVar9 + 1,
                                        (allocator<std::thread> *)&threads);
                    std::_Vector_base<std::thread,_std::allocator<std::thread>_>::_M_deallocate
                              ((_Vector_base<std::thread,_std::allocator<std::thread>_> *)&threads,
                               ptVar2,(long)threads.
                                            super__Vector_base<std::thread,_std::allocator<std::thread>_>
                                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                      (long)ptVar2 >> 3);
                    threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage = ptVar8 + sVar7;
                    threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
                    super__Vector_impl_data._M_start = ptVar8;
                    threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
                    super__Vector_impl_data._M_finish = ptVar9;
                  }
                  else {
                    gtest_ar__2._0_8_ = &server_ctx;
                    std::allocator_traits<std::allocator<std::thread>>::
                    construct<std::thread,bssl::(anonymous_namespace)::SSLTest_ECHThreads_Test::TestBody()::__1>
                              (__a,(thread *)&gtest_ar__2,__args_00);
                    ptVar9 = threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>.
                             _M_impl.super__Vector_impl_data._M_finish + 1;
                    ptVar8 = threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>.
                             _M_impl.super__Vector_impl_data._M_start;
                    threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
                    super__Vector_impl_data._M_finish = ptVar9;
                  }
                  for (; ptVar8 != ptVar9; ptVar8 = ptVar8 + 1) {
                    std::thread::join();
                  }
                  std::vector<std::thread,_std::allocator<std::thread>_>::~vector(&threads);
                }
                else {
                  testing::Message::Message((Message *)&local_150);
                  testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                            ((string *)&threads,(internal *)&gtest_ar__2,
                             (AssertionResult *)
                             "CreateClientAndServer(&client, &server, client_ctx.get(), server_ctx.get())"
                             ,"false","true",pcVar10);
                  testing::internal::AssertHelper::AssertHelper
                            (&local_158,kFatalFailure,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                             ,0x9ca,(char *)threads.
                                            super__Vector_base<std::thread,_std::allocator<std::thread>_>
                                            ._M_impl.super__Vector_impl_data._M_start);
                  testing::internal::AssertHelper::operator=(&local_158,(Message *)&local_150);
LAB_00162410:
                  testing::internal::AssertHelper::~AssertHelper(&local_158);
                  std::__cxx11::string::~string((string *)&threads);
                  if ((_Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       )local_150._M_t.
                        super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        .
                        super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                        ._M_head_impl !=
                      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
                     ) {
                    (**(code **)(*(long *)local_150._M_t.
                                          super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                          .
                                          super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                          ._M_head_impl + 8))();
                  }
                  std::
                  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::~unique_ptr(&gtest_ar__2.message_);
                }
                std::unique_ptr<ssl_st,_bssl::internal::Deleter>::~unique_ptr(&server);
                std::unique_ptr<ssl_st,_bssl::internal::Deleter>::~unique_ptr(&client);
              }
              std::unique_ptr<ssl_ctx_st,_bssl::internal::Deleter>::~unique_ptr(&client_ctx);
            }
            std::unique_ptr<ssl_ctx_st,_bssl::internal::Deleter>::~unique_ptr(&server_ctx);
          }
          std::unique_ptr<ssl_ech_keys_st,_bssl::internal::Deleter>::~unique_ptr(&keys12);
        }
        std::unique_ptr<ssl_ech_keys_st,_bssl::internal::Deleter>::~unique_ptr(&keys1);
        std::unique_ptr<unsigned_char,_bssl::internal::Deleter>::~unique_ptr(&free_ech_config2);
      }
      internal::
      StackAllocatedMovable<evp_hpke_key_st,_void,_&EVP_HPKE_KEY_zero,_&EVP_HPKE_KEY_cleanup,_&EVP_HPKE_KEY_move>
      ::~StackAllocatedMovable(&key2);
      std::unique_ptr<unsigned_char,_bssl::internal::Deleter>::~unique_ptr(&free_ech_config1);
      goto LAB_00162555;
    }
    testing::Message::Message((Message *)&gtest_ar__2);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&key2,(internal *)&threads,
               (AssertionResult *)
               "SSL_marshal_ech_config(&ech_config1, &ech_config1_len, 1, key1.get(), \"public.example\", 16)"
               ,"false","true",pcVar10);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&free_ech_config1,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
               ,0x9aa,(char *)key2.ctx_.kem);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&free_ech_config1,(Message *)&gtest_ar__2);
    this_00 = &free_ech_config1;
  }
  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)this_00);
  std::__cxx11::string::~string((string *)&key2);
  if (gtest_ar__2._0_8_ != 0) {
    (**(code **)(*(long *)gtest_ar__2._0_8_ + 8))();
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
                    super__Vector_impl_data._M_finish);
LAB_00162555:
  internal::
  StackAllocatedMovable<evp_hpke_key_st,_void,_&EVP_HPKE_KEY_zero,_&EVP_HPKE_KEY_cleanup,_&EVP_HPKE_KEY_move>
  ::~StackAllocatedMovable(&key1);
  return;
}

Assistant:

TEST(SSLTest, ECHThreads) {
  // Generate a pair of ECHConfigs.
  bssl::ScopedEVP_HPKE_KEY key1;
  ASSERT_TRUE(EVP_HPKE_KEY_generate(key1.get(), EVP_hpke_x25519_hkdf_sha256()));
  uint8_t *ech_config1;
  size_t ech_config1_len;
  ASSERT_TRUE(SSL_marshal_ech_config(&ech_config1, &ech_config1_len,
                                     /*config_id=*/1, key1.get(),
                                     "public.example", 16));
  bssl::UniquePtr<uint8_t> free_ech_config1(ech_config1);
  bssl::ScopedEVP_HPKE_KEY key2;
  ASSERT_TRUE(EVP_HPKE_KEY_generate(key2.get(), EVP_hpke_x25519_hkdf_sha256()));
  uint8_t *ech_config2;
  size_t ech_config2_len;
  ASSERT_TRUE(SSL_marshal_ech_config(&ech_config2, &ech_config2_len,
                                     /*config_id=*/2, key2.get(),
                                     "public.example", 16));
  bssl::UniquePtr<uint8_t> free_ech_config2(ech_config2);

  // |keys1| contains the first config. |keys12| contains both.
  bssl::UniquePtr<SSL_ECH_KEYS> keys1(SSL_ECH_KEYS_new());
  ASSERT_TRUE(keys1);
  ASSERT_TRUE(SSL_ECH_KEYS_add(keys1.get(), /*is_retry_config=*/1, ech_config1,
                               ech_config1_len, key1.get()));
  bssl::UniquePtr<SSL_ECH_KEYS> keys12(SSL_ECH_KEYS_new());
  ASSERT_TRUE(keys12);
  ASSERT_TRUE(SSL_ECH_KEYS_add(keys12.get(), /*is_retry_config=*/1, ech_config2,
                               ech_config2_len, key2.get()));
  ASSERT_TRUE(SSL_ECH_KEYS_add(keys12.get(), /*is_retry_config=*/0, ech_config1,
                               ech_config1_len, key1.get()));

  bssl::UniquePtr<SSL_CTX> server_ctx =
      CreateContextWithTestCertificate(TLS_method());
  ASSERT_TRUE(server_ctx);
  ASSERT_TRUE(SSL_CTX_set1_ech_keys(server_ctx.get(), keys1.get()));

  bssl::UniquePtr<SSL_CTX> client_ctx(SSL_CTX_new(TLS_method()));
  ASSERT_TRUE(client_ctx);
  bssl::UniquePtr<SSL> client, server;
  ASSERT_TRUE(CreateClientAndServer(&client, &server, client_ctx.get(),
                                    server_ctx.get()));
  ASSERT_TRUE(InstallECHConfigList(client.get(), keys1.get()));

  // In parallel, complete the connection and reconfigure the ECHConfig. Note
  // |keys12| supports all the keys in |keys1|, so the handshake should complete
  // the same whichever the server uses.
  std::vector<std::thread> threads;
  threads.emplace_back([&] {
    ASSERT_TRUE(CompleteHandshakes(client.get(), server.get()));
    EXPECT_TRUE(SSL_ech_accepted(client.get()));
    EXPECT_TRUE(SSL_ech_accepted(server.get()));
  });
  threads.emplace_back([&] {
    EXPECT_TRUE(SSL_CTX_set1_ech_keys(server_ctx.get(), keys12.get()));
  });
  for (auto &thread : threads) {
    thread.join();
  }
}